

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

bool __thiscall Inline::HasArgumentsAccess(Inline *this,Instr *instr,SymID argumentsSymId)

{
  bool bVar1;
  Opnd *this_00;
  Opnd *opnd;
  Opnd *opnd_00;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  SymID argumentsSymId_local;
  Instr *instr_local;
  Inline *this_local;
  
  this_00 = IR::Instr::GetDst(instr);
  opnd = IR::Instr::GetSrc1(instr);
  opnd_00 = IR::Instr::GetSrc2(instr);
  bVar1 = HasArgumentsAccess(this,opnd,argumentsSymId);
  if ((bVar1) || (bVar1 = HasArgumentsAccess(this,opnd_00,argumentsSymId), bVar1)) {
    this_local._7_1_ = true;
  }
  else if ((this_00 == (Opnd *)0x0) ||
          (((bVar1 = IR::Opnd::IsSymOpnd(this_00), !bVar1 &&
            (bVar1 = IR::Opnd::IsIndirOpnd(this_00), !bVar1)) ||
           (bVar1 = IsArgumentsOpnd(this,this_00,argumentsSymId), !bVar1)))) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Inline::HasArgumentsAccess(IR::Instr * instr, SymID argumentsSymId)
{
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();

    // Super conservative here, if we see the arguments or any of its alias being used in any
    // other opcode just don't do this optimization.
    if (HasArgumentsAccess(src1, argumentsSymId) || HasArgumentsAccess(src2, argumentsSymId))
    {
        return true;
    }

    if (dst)
    {
        // For dst no need to check for RegOpnd
        if (dst->IsSymOpnd() || dst->IsIndirOpnd())
        {
            if (IsArgumentsOpnd(dst, argumentsSymId))
            {
                return true;
            }
        }
    }

    return false;
}